

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O3

Region * __thiscall Region::GetFirstAncestorOfNonExceptingFinallyParent(Region *this)

{
  RegionType RVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Region *pRVar5;
  
  while (RVar1 = this->type, RVar1 == RegionTypeFinally) {
    if (this->matchingTryRegion->matchingFinallyOnNoExceptRegion != this) goto LAB_0061f7ac;
    this = this->parent;
    if (this == (Region *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
                         ,0x52,"(ancestor && !ancestor->IsNonExceptingFinally())",
                         "ancestor && !ancestor->IsNonExceptingFinally()");
      if (bVar3) {
        *puVar4 = 0;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
                           ,0x59,"(ancestor)","ancestor");
        if (bVar3) {
          *puVar4 = 0;
          return (Region *)0x0;
        }
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  if (RVar1 == RegionTypeRoot) {
    return this;
  }
LAB_0061f7ac:
  pRVar5 = this->parent;
  if ((pRVar5->type == RegionTypeFinally) &&
     (pRVar5->matchingTryRegion->matchingFinallyOnNoExceptRegion == pRVar5)) {
    do {
      pRVar5 = pRVar5->parent;
      if (pRVar5->type != RegionTypeFinally) {
        return pRVar5;
      }
    } while (pRVar5->matchingTryRegion->matchingFinallyOnNoExceptRegion == pRVar5);
    return pRVar5;
  }
  if (RVar1 != RegionTypeRoot) {
    return pRVar5;
  }
  return this;
}

Assistant:

Region *
Region::GetFirstAncestorOfNonExceptingFinallyParent()
{
    Region * ancestor = this;
    while (ancestor && ancestor->IsNonExceptingFinally())
    {
        ancestor = ancestor->GetParent();
    }
    // ancestor is the first ancestor which is not a non exception finally
    Assert(ancestor && !ancestor->IsNonExceptingFinally());
    // If the ancestor's parent is a non exception finally, recurse
    if (ancestor && ancestor->GetType() != RegionTypeRoot && ancestor->GetParent()->IsNonExceptingFinally())
    {
        return ancestor->GetParent()->GetFirstAncestorOfNonExceptingFinally();
    }

    Assert(ancestor);
    // Null check added to avoid prefast warning only
    return ancestor ? (ancestor->GetType() == RegionTypeRoot ? ancestor : ancestor->GetParent()) : nullptr;
}